

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

void __thiscall QDebug::putInt128(QDebug *this,void *p)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [11];
  undefined1 auVar5 [12];
  undefined1 auVar6 [13];
  undefined1 auVar7 [14];
  long lVar8;
  undefined1 n [16];
  char *pcVar9;
  Int128Buffer *in_RSI;
  long in_FS_OFFSET;
  bool bVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  byte bVar24;
  char *dst;
  qint128 i;
  Int128Buffer buffer;
  QTextStream *local_90;
  long local_88;
  QTextStream *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff98;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  char *in_stack_ffffffffffffffc8;
  char *string;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_90 = *(QTextStream **)in_RSI->_M_elems;
  lVar8 = *(long *)(in_RSI->_M_elems + 8);
  local_48 = (char)local_90;
  cStack_47 = (char)((ulong)local_90 >> 8);
  cStack_46 = (char)((ulong)local_90 >> 0x10);
  cStack_45 = (char)((ulong)local_90 >> 0x18);
  cStack_44 = (char)((ulong)local_90 >> 0x20);
  cStack_43 = (char)((ulong)local_90 >> 0x28);
  cStack_42 = (char)((ulong)local_90 >> 0x30);
  cStack_41 = (char)((ulong)local_90 >> 0x38);
  cStack_40 = (char)lVar8;
  cStack_3f = (char)((ulong)lVar8 >> 8);
  cStack_3e = (char)((ulong)lVar8 >> 0x10);
  cStack_3d = (char)((ulong)lVar8 >> 0x18);
  cStack_3c = (char)((ulong)lVar8 >> 0x20);
  cStack_3b = (char)((ulong)lVar8 >> 0x28);
  cStack_3a = (char)((ulong)lVar8 >> 0x30);
  cStack_39 = (char)((ulong)lVar8 >> 0x38);
  cVar11 = -(cStack_46 == '\0');
  cVar12 = -(cStack_45 == '\0');
  cVar13 = -(cStack_44 == '\0');
  cVar14 = -(cStack_43 == '\0');
  cVar15 = -(cStack_42 == '\0');
  cVar16 = -(cStack_41 == '\0');
  cVar17 = -(cStack_40 == '\0');
  cVar18 = -(cStack_3f == '\0');
  cVar19 = -(cStack_3e == '\0');
  cVar20 = -(cStack_3d == '\0');
  cVar21 = -(cStack_3c == '\0');
  cVar22 = -(cStack_3b == '\0');
  cVar23 = -(cStack_3a == '\0');
  bVar24 = -(cStack_39 == -0x80);
  auVar2[1] = -(cStack_47 == '\0');
  auVar2[0] = -(local_48 == '\0');
  auVar2[2] = cVar11;
  auVar2[3] = cVar12;
  auVar2[4] = cVar13;
  auVar2[5] = cVar14;
  auVar2[6] = cVar15;
  auVar2[7] = cVar16;
  auVar2[8] = cVar17;
  auVar2[9] = cVar18;
  auVar2[10] = cVar19;
  auVar2[0xb] = cVar20;
  auVar2[0xc] = cVar21;
  auVar2[0xd] = cVar22;
  auVar2[0xe] = cVar23;
  auVar2[0xf] = bVar24;
  auVar3[1] = -(cStack_47 == '\0');
  auVar3[0] = -(local_48 == '\0');
  auVar3[2] = cVar11;
  auVar3[3] = cVar12;
  auVar3[4] = cVar13;
  auVar3[5] = cVar14;
  auVar3[6] = cVar15;
  auVar3[7] = cVar16;
  auVar3[8] = cVar17;
  auVar3[9] = cVar18;
  auVar3[10] = cVar19;
  auVar3[0xb] = cVar20;
  auVar3[0xc] = cVar21;
  auVar3[0xd] = cVar22;
  auVar3[0xe] = cVar23;
  auVar3[0xf] = bVar24;
  auVar7[1] = cVar12;
  auVar7[0] = cVar11;
  auVar7[2] = cVar13;
  auVar7[3] = cVar14;
  auVar7[4] = cVar15;
  auVar7[5] = cVar16;
  auVar7[6] = cVar17;
  auVar7[7] = cVar18;
  auVar7[8] = cVar19;
  auVar7[9] = cVar20;
  auVar7[10] = cVar21;
  auVar7[0xb] = cVar22;
  auVar7[0xc] = cVar23;
  auVar7[0xd] = bVar24;
  auVar6[1] = cVar13;
  auVar6[0] = cVar12;
  auVar6[2] = cVar14;
  auVar6[3] = cVar15;
  auVar6[4] = cVar16;
  auVar6[5] = cVar17;
  auVar6[6] = cVar18;
  auVar6[7] = cVar19;
  auVar6[8] = cVar20;
  auVar6[9] = cVar21;
  auVar6[10] = cVar22;
  auVar6[0xb] = cVar23;
  auVar6[0xc] = bVar24;
  auVar5[1] = cVar14;
  auVar5[0] = cVar13;
  auVar5[2] = cVar15;
  auVar5[3] = cVar16;
  auVar5[4] = cVar17;
  auVar5[5] = cVar18;
  auVar5[6] = cVar19;
  auVar5[7] = cVar20;
  auVar5[8] = cVar21;
  auVar5[9] = cVar22;
  auVar5[10] = cVar23;
  auVar5[0xb] = bVar24;
  auVar4[1] = cVar15;
  auVar4[0] = cVar14;
  auVar4[2] = cVar16;
  auVar4[3] = cVar17;
  auVar4[4] = cVar18;
  auVar4[5] = cVar19;
  auVar4[6] = cVar20;
  auVar4[7] = cVar21;
  auVar4[8] = cVar22;
  auVar4[9] = cVar23;
  auVar4[10] = bVar24;
  if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB141(auVar7 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar6 >> 7,0) & 1) << 3 |
               (ushort)(SUB121(auVar5 >> 7,0) & 1) << 4 | (ushort)(SUB111(auVar4 >> 7,0) & 1) << 5 |
               (ushort)((byte)(CONCAT19(bVar24,CONCAT18(cVar23,CONCAT17(cVar22,CONCAT16(cVar21,
                                                  CONCAT15(cVar20,CONCAT14(cVar19,CONCAT13(cVar18,
                                                  CONCAT12(cVar17,CONCAT11(cVar16,cVar15))))))))) >>
                              7) & 1) << 6 |
               (ushort)((byte)(CONCAT18(bVar24,CONCAT17(cVar23,CONCAT16(cVar22,CONCAT15(cVar21,
                                                  CONCAT14(cVar20,CONCAT13(cVar19,CONCAT12(cVar18,
                                                  CONCAT11(cVar17,cVar16)))))))) >> 7) & 1) << 7 |
              (ushort)(bVar24 >> 7) << 0xf) == 0xffff) {
    QTextStream::operator<<(in_stack_ffffffffffffff88,in_stack_ffffffffffffffc8);
  }
  else {
    string = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = lVar8;
    if (lVar8 < 0) {
      bVar10 = local_90 != (QTextStream *)0x0;
      local_90 = (QTextStream *)-(long)local_90;
      local_88 = -(ulong)bVar10 - lVar8;
    }
    n._8_8_ = in_stack_ffffffffffffff98;
    n._0_8_ = local_88;
    pcVar9 = anon_unknown.dwarf_1d6ecc::i128ToStringHelper(in_RSI,(quint128)n);
    if (lVar8 < 0) {
      pcVar9[-1] = '-';
    }
    QTextStream::operator<<(local_90,string);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDebug::putInt128([[maybe_unused]] const void *p)
{
#ifdef QT_SUPPORTS_INT128
    Q_ASSERT(p);
    qint128 i;
    memcpy(&i, p, sizeof(i)); // alignment paranoia
    if (i == Q_INT128_MIN) {
        // -i is not representable, hardcode the result:
        stream->ts << Q_INT128_MIN_STR;
    } else {
        Int128Buffer buffer;
        auto dst = i128ToStringHelper(buffer, i < 0 ? -i : i);
        if (i < 0)
            *--dst = '-';
        stream->ts << dst;
    }
    return;
#endif // QT_SUPPORTS_INT128
    stream->ts << int128Warning();
}